

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

NumericExpr __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::MakeBinary
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,Kind kind,NumericExpr lhs,
          NumericExpr rhs)

{
  Kind in_ESI;
  TestProblemBuilder *in_RDI;
  Argument1 in_stack_ffffffffffffff78;
  allocator<char> local_51;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  BasicTestExpr<0> *local_30;
  BasicTestExpr<0> *local_28;
  Kind local_1c [4];
  BasicTestExpr<0> local_c;
  BasicTestExpr<0> local_8;
  BasicTestExpr<0> local_4;
  
  local_28 = &local_8;
  local_30 = &local_c;
  local_1c[0] = in_ESI;
  internal::Unused<mp::expr::Kind,BasicTestExpr<0>*,BasicTestExpr<0>*>(local_1c,&local_28,&local_30)
  ;
  expr::str(local_1c[0]);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  TestProblemBuilder::ReportUnhandledConstruct(in_RDI,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator(&local_51);
  BasicTestExpr<0>::BasicTestExpr(&local_4,NULL_ID);
  return (NumericExpr)local_4.id_;
}

Assistant:

NumericExpr MakeBinary(expr::Kind kind, NumericExpr lhs, NumericExpr rhs) {
    internal::Unused(kind, &lhs, &rhs);
    MP_DISPATCH(ReportUnhandledConstruct(str(kind)));
    return NumericExpr();
  }